

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

void __thiscall SocketPP::TCPServer::onReceive(TCPServer *this,int fd,byte *buf,size_t len)

{
  TCPStream local_44;
  Message local_40;
  size_t local_28;
  size_t len_local;
  byte *buf_local;
  TCPServer *pTStack_10;
  int fd_local;
  TCPServer *this_local;
  
  local_28 = len;
  len_local = (size_t)buf;
  buf_local._4_4_ = fd;
  pTStack_10 = this;
  TCPStream::TCPStream(&local_44,fd);
  Message::create(&local_40,local_44,(byte *)len_local,local_28);
  onReceive(this,&local_40);
  Message::~Message(&local_40);
  return;
}

Assistant:

void TCPServer::onReceive(int fd, const byte* buf, size_t len) {
    TCPServer::onReceive(Message::create(fd, buf, len));
}